

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.h
# Opt level: O0

unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *
inline_check_non_fatal<std::unique_ptr<ValidationSignals,std::default_delete<ValidationSignals>>const&>
          (unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *val,char *file,
          int line,char *func,char *assertion)

{
  long lVar1;
  string_view file_00;
  bool bVar2;
  undefined8 uVar3;
  unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *in_RDI;
  long in_FS_OFFSET;
  string_view in_stack_00000020;
  unique_ptr<ValidationSignals,_std::default_delete<ValidationSignals>_> *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff70;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff94;
  NonFatalCheckError *in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  string_view in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = std::unique_ptr::operator_cast_to_bool(in_stack_ffffffffffffff58);
  if (bVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return in_RDI;
    }
  }
  else {
    uVar3 = __cxa_allocate_exception(0x10);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    file_00._M_str = in_stack_ffffffffffffffd8;
    file_00._M_len = in_stack_ffffffffffffffd0;
    NonFatalCheckError::NonFatalCheckError
              (in_stack_ffffffffffffff98,in_stack_ffffffffffffffe0,file_00,in_stack_ffffffffffffff94
               ,in_stack_00000020);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&NonFatalCheckError::typeinfo,NonFatalCheckError::~NonFatalCheckError);
    }
  }
  __stack_chk_fail();
}

Assistant:

T&& inline_check_non_fatal(LIFETIMEBOUND T&& val, const char* file, int line, const char* func, const char* assertion)
{
    if (!val) {
        throw NonFatalCheckError{assertion, file, line, func};
    }
    return std::forward<T>(val);
}